

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O0

string * __thiscall
libcellml::XmlNode::attribute_abi_cxx11_
          (string *__return_storage_ptr__,XmlNode *this,char *attributeName)

{
  bool bVar1;
  char *__s;
  allocator<char> local_61;
  string local_60 [32];
  char *local_40;
  xmlChar *attributeValue;
  undefined1 local_21;
  char *local_20;
  char *attributeName_local;
  XmlNode *this_local;
  string *attributeValueString;
  
  local_21 = 0;
  local_20 = attributeName;
  attributeName_local = (char *)this;
  this_local = (XmlNode *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = hasAttribute(this,local_20);
  if (bVar1) {
    __s = (char *)xmlGetProp(this->mPimpl->mXmlNodePtr,local_20);
    local_40 = __s;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_60,__s,&local_61);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_60);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator(&local_61);
    (*_xmlFree)(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XmlNode::attribute(const char *attributeName) const
{
    std::string attributeValueString;
    if (hasAttribute(attributeName)) {
        xmlChar *attributeValue = xmlGetProp(mPimpl->mXmlNodePtr, reinterpret_cast<const xmlChar *>(attributeName));
        attributeValueString = std::string(reinterpret_cast<const char *>(attributeValue));
        xmlFree(attributeValue);
    }
    return attributeValueString;
}